

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O2

void __thiscall QProgressDialogPrivate::_q_disconnectOnClose(QProgressDialogPrivate *this)

{
  QPointer<QObject> *this_00;
  QObject *pQVar1;
  Data *pDVar2;
  bool bVar3;
  char *pcVar4;
  QObject *pQVar5;
  
  pQVar1 = *(QObject **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  this_00 = &this->receiverToDisconnectOnClose;
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar3) {
    pDVar2 = (this_00->wp).d;
    if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
      pQVar5 = (QObject *)0x0;
    }
    else {
      pQVar5 = (this->receiverToDisconnectOnClose).wp.value;
    }
    pcVar4 = (this->memberToDisconnectOnClose).d.ptr;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)&QByteArray::_empty;
    }
    QObject::disconnect(pQVar1,"2canceled()",pQVar5,pcVar4);
    QWeakPointer<QObject>::assign<QObject>(&this_00->wp,(QObject *)0x0);
  }
  QByteArray::clear();
  return;
}

Assistant:

void QProgressDialogPrivate::_q_disconnectOnClose()
{
    Q_Q(QProgressDialog);
    if (receiverToDisconnectOnClose) {
        QObject::disconnect(q, SIGNAL(canceled()), receiverToDisconnectOnClose,
                            memberToDisconnectOnClose);
        receiverToDisconnectOnClose = nullptr;
    }
    memberToDisconnectOnClose.clear();
}